

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ostream * CLI::detail::streamOutAsParagraph
                    (ostream *out,string *text,size_t paragraphWidth,string *linePrefix,
                    bool skipPrefixOnFirstLine)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  string *in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  ostream *in_RDI;
  byte in_R8B;
  size_t charsWritten;
  string word;
  istringstream iss;
  string line;
  istringstream lss;
  long local_390;
  allocator local_381;
  string local_380 [32];
  istringstream local_360 [407];
  allocator local_1c9;
  string local_1c8 [32];
  istringstream local_1a8 [391];
  byte local_21;
  string *local_20;
  ulong local_18;
  undefined8 local_10;
  ostream *local_8;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_21 == 0) {
    ::std::operator<<(in_RDI,in_RCX);
  }
  ::std::__cxx11::istringstream::istringstream(local_1a8,local_10,8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1c8,"",&local_1c9);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  while( true ) {
    piVar3 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,local_1c8);
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    ::std::__cxx11::istringstream::istringstream(local_360,local_1c8,8);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_380,"",&local_381);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
    local_390 = 0;
    while( true ) {
      piVar3 = ::std::operator>>((istream *)local_360,local_380);
      bVar1 = ::std::ios::operator_cast_to_bool
                        ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      lVar4 = ::std::__cxx11::string::length();
      if (local_18 < (ulong)(lVar4 + local_390)) {
        poVar6 = ::std::operator<<(local_8,'\n');
        ::std::operator<<(poVar6,local_20);
        local_390 = 0;
      }
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_380);
      if (*pcVar5 == '\"') {
        ::std::operator<<(local_8,"  ");
      }
      poVar6 = ::std::operator<<(local_8,local_380);
      ::std::operator<<(poVar6," ");
      lVar4 = ::std::__cxx11::string::length();
      local_390 = lVar4 + 1 + local_390;
    }
    bVar2 = ::std::ios::eof();
    if ((bVar2 & 1) == 0) {
      poVar6 = ::std::operator<<(local_8,'\n');
      ::std::operator<<(poVar6,local_20);
    }
    ::std::__cxx11::string::~string(local_380);
    ::std::__cxx11::istringstream::~istringstream(local_360);
  }
  ::std::__cxx11::string::~string(local_1c8);
  ::std::__cxx11::istringstream::~istringstream(local_1a8);
  return local_8;
}

Assistant:

CLI11_INLINE std::ostream &streamOutAsParagraph(std::ostream &out,
                                                const std::string &text,
                                                std::size_t paragraphWidth,
                                                const std::string &linePrefix,
                                                bool skipPrefixOnFirstLine) {
    if(!skipPrefixOnFirstLine)
        out << linePrefix;  // First line prefix

    std::istringstream lss(text);
    std::string line = "";
    while(std::getline(lss, line)) {
        std::istringstream iss(line);
        std::string word = "";
        std::size_t charsWritten = 0;

        while(iss >> word) {
            if(word.length() + charsWritten > paragraphWidth) {
                out << '\n' << linePrefix;
                charsWritten = 0;
            }
            
            if(word[0] == '\"')
                out << "  ";
            out << word << " ";
            charsWritten += word.length() + 1;
        }

        if(!lss.eof())
            out << '\n' << linePrefix;
    }
    return out;
}